

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  char *pcVar1;
  initializer_list<pybind11::detail::type_info_*> __l;
  bool bVar2;
  type_info *ptVar3;
  PyObject *pPVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  mapped_type *ppvVar7;
  mapped_type *this_00;
  PyTypeObject *type;
  type_info *ptVar8;
  list_accessor local_160;
  type_info *parent_tinfo;
  type_info *local_130;
  iterator local_128;
  size_type local_120;
  type_index local_118;
  type_index tindex;
  internals *internals;
  type_info *tinfo;
  string local_f8 [32];
  char local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [55];
  allocator local_81;
  string local_80 [32];
  char local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  PyObject *local_20;
  type_record *local_18;
  type_record *rec_local;
  generic_type *this_local;
  
  local_18 = rec;
  rec_local = (type_record *)this;
  bVar2 = handle::operator_cast_to_bool(&rec->scope);
  if (bVar2) {
    local_20 = (local_18->scope).m_ptr;
    bVar2 = hasattr((handle)local_20,local_18->name);
    if (bVar2) {
      pcVar1 = local_18->name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,pcVar1,&local_81);
      std::operator+(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              "generic_type: cannot initialize type \"");
      std::operator+(local_40,local_60);
      pybind11_fail(local_40);
    }
  }
  sVar5 = 0;
  ptVar3 = get_type_info(local_18->type,false);
  if (ptVar3 == (type_info *)0x0) {
    pPVar4 = make_new_python_type(local_18);
    (this->super_object).super_handle.m_ptr = pPVar4;
    ptVar3 = (type_info *)operator_new(0x88);
    ptVar3->get_buffer = (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0;
    ptVar3->get_buffer_data = (void *)0x0;
    (ptVar3->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar3->direct_conversions =
         (vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *)0x0;
    (ptVar3->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptVar3->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptVar3->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptVar3->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar3->dealloc = (_func_void_value_and_holder_ptr *)0x0;
    (ptVar3->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ptVar3->operator_new = (_func_void_ptr_size_t *)0x0;
    ptVar3->init_holder = (_func_void_instance_ptr_void_ptr *)0x0;
    ptVar3->type_size = 0;
    ptVar3->holder_size_in_ptrs = 0;
    ptVar3->type = (PyTypeObject *)0x0;
    ptVar3->cpptype = (type_info *)0x0;
    *(undefined8 *)&ptVar3->field_0x80 = 0;
    type_info::type_info(ptVar3);
    ptVar3->type = (PyTypeObject *)(this->super_object).super_handle.m_ptr;
    ptVar3->cpptype = local_18->type;
    ptVar3->type_size = local_18->type_size;
    ptVar3->operator_new = local_18->operator_new;
    sVar5 = size_in_ptrs((detail *)local_18->holder_size,sVar5);
    ptVar3->holder_size_in_ptrs = sVar5;
    ptVar3->init_holder = local_18->init_holder;
    ptVar3->dealloc = local_18->dealloc;
    ptVar3->field_0x80 = ptVar3->field_0x80 | 1;
    ptVar3->field_0x80 = ptVar3->field_0x80 | 2;
    tindex._M_target = (type_info *)get_internals();
    std::type_index::type_index(&local_118,local_18->type);
    pmVar6 = std::
             unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
             ::operator[]((unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
                           *)(tindex._M_target + 0xe0),&local_118);
    ptVar3->direct_conversions = pmVar6;
    ptVar3->field_0x80 = ptVar3->field_0x80 & 0xfb | ((byte)local_18->field_0x58 >> 3 & 1) << 2;
    ppvVar7 = std::
              unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
              ::operator[]((unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
                            *)tindex._M_target,&local_118);
    *ppvVar7 = ptVar3;
    local_128 = &local_130;
    local_120 = 1;
    parent_tinfo = (type_info *)(this->super_object).super_handle.m_ptr;
    local_130 = ptVar3;
    this_00 = std::
              unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
              ::operator[]((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                            *)(tindex._M_target + 0x38),(key_type *)&parent_tinfo);
    __l._M_len = local_120;
    __l._M_array = local_128;
    std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
    operator=(this_00,__l);
    sVar5 = list::size(&local_18->bases);
    if ((sVar5 < 2) && ((local_18->field_0x58 & 1) == 0)) {
      sVar5 = list::size(&local_18->bases);
      if (sVar5 == 1) {
        list::operator[](&local_160,&local_18->bases,0);
        type = (PyTypeObject *)
               accessor<pybind11::detail::accessor_policies::list_item>::ptr(&local_160);
        ptVar8 = get_type_info(type);
        accessor<pybind11::detail::accessor_policies::list_item>::~accessor(&local_160);
        ptVar3->field_0x80 = ptVar3->field_0x80 & 0xfd | ((byte)ptVar8->field_0x80 >> 1 & 1) << 1;
      }
    }
    else {
      mark_parents_nonsimple(this,ptVar3->type);
      ptVar3->field_0x80 = ptVar3->field_0x80 & 0xfd;
    }
    return;
  }
  pcVar1 = local_18->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,pcVar1,(allocator *)((long)&tinfo + 7));
  std::operator+(local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "generic_type: type \"");
  std::operator+(local_b8,local_d8);
  pybind11_fail(local_b8);
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if (get_type_info(*rec.type))
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_holder = rec.init_holder;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        tinfo->default_holder = rec.default_holder;
        internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }
    }